

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O0

void copy_segment_id(CommonModeInfoParams *mi_params,uint8_t *last_segment_ids,
                    uint8_t *current_segment_ids,int mi_offset,int x_mis,int y_mis)

{
  int iVar1;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int y_1;
  int y;
  int stride;
  undefined4 local_30;
  undefined4 local_2c;
  
  iVar1 = *(int *)(in_RDI + 0x10);
  if (in_RSI == 0) {
    for (local_30 = 0; local_30 < in_R9D; local_30 = local_30 + 1) {
      memset((void *)(in_RDX + (in_ECX + local_30 * iVar1)),0,(long)in_R8D);
    }
  }
  else {
    for (local_2c = 0; local_2c < in_R9D; local_2c = local_2c + 1) {
      memcpy((void *)(in_RDX + (in_ECX + local_2c * iVar1)),
             (void *)(in_RSI + (in_ECX + local_2c * iVar1)),(long)in_R8D);
    }
  }
  return;
}

Assistant:

static void copy_segment_id(const CommonModeInfoParams *const mi_params,
                            const uint8_t *last_segment_ids,
                            uint8_t *current_segment_ids, int mi_offset,
                            int x_mis, int y_mis) {
  const int stride = mi_params->mi_cols;
  if (last_segment_ids) {
    assert(last_segment_ids != current_segment_ids);
    for (int y = 0; y < y_mis; y++) {
      memcpy(&current_segment_ids[mi_offset + y * stride],
             &last_segment_ids[mi_offset + y * stride],
             sizeof(current_segment_ids[0]) * x_mis);
    }
  } else {
    for (int y = 0; y < y_mis; y++) {
      memset(&current_segment_ids[mi_offset + y * stride], 0,
             sizeof(current_segment_ids[0]) * x_mis);
    }
  }
}